

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

long map2json_getArrayId(char *key)

{
  int iVar1;
  char *__s;
  size_t __size;
  char *__nptr;
  long in_RDI;
  long length;
  int value;
  char *buffer;
  long local_8;
  
  if (in_RDI == 0) {
    local_8 = -1;
  }
  else {
    __s = (char *)(in_RDI + 1);
    __size = strlen(__s);
    __nptr = (char *)calloc(1,__size);
    memcpy(__nptr,__s,__size);
    __nptr[__size - 1] = '\0';
    if (*__s == 'x') {
      free(__nptr);
      local_8 = -2;
    }
    else {
      iVar1 = atoi(__nptr);
      free(__nptr);
      local_8 = (long)iVar1;
    }
  }
  return local_8;
}

Assistant:

static long map2json_getArrayId(char *key) {
	DEBUG_TEXT("map2json_getArrayId(%s)... ", key);

	char *buffer;
	int value;

	if ( key == NULL ) {
		return ARRAYID_NOT_SET;
	}
	key++;
	long length = strlen(key);

	buffer = calloc(sizeof(char), length);
	memcpy(buffer, key, length);
	buffer[length - 1] = '\0';

	if ( *key == JSON2MAP_MAP_ARRAY_COUNT ) {
		free(buffer);
		return ARRAYID_IS_COUNT;
	}

	value = atoi(buffer);
	free(buffer);
	DEBUG_TEXT("map2json_getArrayId(%s)... DONE", key);
	return value;
}